

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

ostream * tcu::operator<<(ostream *os,Interval *interval)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  
  uVar2 = (ulong)interval->m_hasNaN;
  if (interval->m_lo < interval->m_hi || interval->m_lo == interval->m_hi) {
    pcVar4 = "";
    if (uVar2 != 0) {
      pcVar4 = "~";
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    poVar1 = std::ostream::_M_insert<double>(interval->m_lo);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::ostream::_M_insert<double>(interval->m_hi);
    pcVar4 = "]";
    lVar3 = 1;
  }
  else {
    poVar1 = os;
    if (uVar2 == 0) {
      pcVar4 = "()";
      lVar3 = 2;
    }
    else {
      pcVar4 = "[NaN]";
      lVar3 = 5;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,lVar3);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Interval& interval)
{
	if (interval.empty())
		if (interval.hasNaN())
			os << "[NaN]";
		else
			os << "()";
	else
		os << (interval.hasNaN() ? "~" : "")
		   << "[" << interval.lo() << ", " << interval.hi() << "]";
	return os;
}